

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLAES.cpp
# Opt level: O0

bool __thiscall OSSLAES::checkLength(OSSLAES *this,int insize,int minsize,char *operation)

{
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  bool local_1;
  
  if (in_ESI < in_EDX) {
    softHSMLog(3,"checkLength",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLAES.cpp"
               ,0x4f,"key data to %s too small",in_RCX);
    local_1 = false;
  }
  else if (in_ESI % 8 == 0) {
    local_1 = true;
  }
  else {
    softHSMLog(3,"checkLength",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLAES.cpp"
               ,0x54,"key data to %s not aligned",in_RCX);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool OSSLAES::checkLength(const int insize, const int minsize, const char * const operation) const
{
	if (insize < minsize)
	{
		ERROR_MSG("key data to %s too small", operation);
		return false;
	}
	if ((insize % 8) != 0)
	{
		ERROR_MSG("key data to %s not aligned", operation);
		return false;
	}
	return true;
}